

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O0

CURLcode get_server_message(SASL *sasl,Curl_easy *data,bufref *out)

{
  uchar *src;
  char *serverdata;
  size_t msglen;
  uchar *msg;
  bufref *pbStack_20;
  CURLcode result;
  bufref *out_local;
  Curl_easy *data_local;
  SASL *sasl_local;
  
  msg._4_4_ = 0;
  pbStack_20 = out;
  out_local = (bufref *)data;
  data_local = (Curl_easy *)sasl;
  msg._4_4_ = (*sasl->params->getmessage)(data,out);
  if ((msg._4_4_ == CURLE_OK) && ((*(ushort *)(*(long *)data_local + 0x3a) & 1) != 0)) {
    src = Curl_bufref_ptr(pbStack_20);
    if ((*src == '\0') || (*src == '=')) {
      Curl_bufref_set(pbStack_20,(void *)0x0,0,(_func_void_void_ptr *)0x0);
    }
    else {
      msg._4_4_ = Curl_base64_decode((char *)src,(uchar **)&msglen,(size_t *)&serverdata);
      if (msg._4_4_ == CURLE_OK) {
        Curl_bufref_set(pbStack_20,(void *)msglen,(size_t)serverdata,curl_free);
      }
    }
  }
  return msg._4_4_;
}

Assistant:

static CURLcode get_server_message(struct SASL *sasl, struct Curl_easy *data,
                                   struct bufref *out)
{
  CURLcode result = CURLE_OK;

  result = sasl->params->getmessage(data, out);
  if(!result && (sasl->params->flags & SASL_FLAG_BASE64)) {
    unsigned char *msg;
    size_t msglen;
    const char *serverdata = (const char *) Curl_bufref_ptr(out);

    if(!*serverdata || *serverdata == '=')
      Curl_bufref_set(out, NULL, 0, NULL);
    else {
      result = Curl_base64_decode(serverdata, &msg, &msglen);
      if(!result)
        Curl_bufref_set(out, msg, msglen, curl_free);
    }
  }
  return result;
}